

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# groups.c
# Opt level: O1

void comex_group_init(void)

{
  MPI_Comm poVar1;
  comex_igroup_t *pcVar2;
  
  if (group_list == (comex_igroup_t *)0x0) {
    pcVar2 = (comex_igroup_t *)malloc(0x20);
    group_list = pcVar2;
    pcVar2->id = 0;
    pcVar2->next = (group_link *)0x0;
    poVar1 = l_state.world_comm;
    pcVar2->comm = l_state.world_comm;
    MPI_Comm_group(poVar1,&pcVar2->group);
    return;
  }
  __assert_fail("group_list == NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-mpi/groups.c"
                ,0x106,"void comex_group_init()");
}

Assistant:

void comex_group_init() 
{
    /* create the head of the group linked list */
    assert(group_list == NULL);
    group_list = malloc(sizeof(comex_igroup_t));
    group_list->id = COMEX_GROUP_WORLD;
    group_list->next = NULL;

    /* save MPI world group and communicatior in COMEX_GROUP_WORLD */
    group_list->comm = l_state.world_comm;
    MPI_Comm_group(group_list->comm, &(group_list->group));
}